

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

void __thiscall amrex::ParmParse::getkth(ParmParse *this,char *name,int k,string *ptr,int ival)

{
  Table *table;
  allocator local_71;
  string local_70;
  string local_50;
  
  table = this->m_table;
  std::__cxx11::string::string((string *)&local_50,name,&local_71);
  prefixedName(&local_70,this,&local_50);
  (anonymous_namespace)::(anonymous_namespace)::sgetval<std::__cxx11::string>
            (table,&local_70,ptr,ival,k);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void
ParmParse::getkth (const char* name,
                   int         k,
                   std::string&    ptr,
                   int         ival) const
{
    sgetval(m_table, prefixedName(name),ptr,ival,k);
}